

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrGLContext.cpp
# Opt level: O0

void __thiscall
sglr::GLContext::copyTexSubImage2D
          (GLContext *this,deUint32 target,int level,int xoffset,int yoffset,int x,int y,int width,
          int height)

{
  code *pcVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  MessageBuilder *pMVar7;
  undefined4 extraout_var;
  int *piVar8;
  Enum<int,_2UL> EVar9;
  undefined1 local_1e0 [8];
  IVec2 offset;
  Enum<int,_2UL> local_1c8 [2];
  MessageBuilder local_1a8;
  int local_24;
  int local_20;
  int x_local;
  int yoffset_local;
  int xoffset_local;
  int level_local;
  deUint32 target_local;
  GLContext *this_local;
  
  local_24 = x;
  local_20 = yoffset;
  x_local = xoffset;
  yoffset_local = level;
  xoffset_local = target;
  _level_local = this;
  if ((this->m_logFlags & 1) != 0) {
    tcu::TestLog::operator<<(&local_1a8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_1a8,(char (*) [21])"glCopyTexSubImage2D(");
    EVar9 = glu::getTextureTargetStr(xoffset_local);
    offset.m_data = (int  [2])EVar9.m_getName;
    local_1c8[0].m_value = EVar9.m_value;
    local_1c8[0].m_getName = (GetNameFunc)offset.m_data;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,local_1c8);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x12ed2ef);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&yoffset_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x12ed2ef);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&x_local);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x12ed2ef);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_20);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x12ed2ef);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_24);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x12ed2ef);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&y);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x12ed2ef);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&width);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [3])0x12ed2ef);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&height);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [2])0x130f08e);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  getReadOffset((GLContext *)local_1e0);
  iVar6 = (*this->m_context->_vptr_RenderContext[3])();
  iVar5 = xoffset_local;
  iVar4 = yoffset_local;
  iVar3 = x_local;
  iVar2 = local_20;
  pcVar1 = *(code **)(CONCAT44(extraout_var,iVar6) + 0x360);
  piVar8 = tcu::Vector<int,_2>::x((Vector<int,_2> *)local_1e0);
  iVar6 = *piVar8 + local_24;
  piVar8 = tcu::Vector<int,_2>::y((Vector<int,_2> *)local_1e0);
  (*pcVar1)(iVar5,iVar4,iVar3,iVar2,iVar6,*piVar8 + y,width,height);
  return;
}

Assistant:

void GLContext::copyTexSubImage2D (deUint32 target, int level, int xoffset, int yoffset, int x, int y, int width, int height)
{
	if ((m_logFlags & GLCONTEXT_LOG_CALLS) != 0)
		m_log << TestLog::Message << "glCopyTexSubImage2D("
								  << glu::getTextureTargetStr(target) << ", "
								  << level
								  << ", " << xoffset << ", " << yoffset << ", "
								  << x << ", " << y << ", "
								  << width << ", " << height << ")"
			  << TestLog::EndMessage;

	tcu::IVec2 offset = getReadOffset();
	m_context.getFunctions().copyTexSubImage2D(target, level, xoffset, yoffset, offset.x()+x, offset.y()+y, width, height);
}